

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O2

void __thiscall
t_javame_generator::generate_deep_copy_non_container
          (t_javame_generator *this,ostream *out,string *source_name,string *dest_name,t_type *type)

{
  int iVar1;
  ostream *poVar2;
  string sStack_48;
  
  iVar1 = (*(type->super_t_doc)._vptr_t_doc[5])(type);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(type->super_t_doc)._vptr_t_doc[10])(type);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(type->super_t_doc)._vptr_t_doc[9])(type);
      if ((char)iVar1 == '\0') {
        poVar2 = std::operator<<(out,"new ");
        type_name_abi_cxx11_(&sStack_48,this,type,true,false,false);
        poVar2 = std::operator<<(poVar2,(string *)&sStack_48);
        poVar2 = std::operator<<(poVar2,"(");
        poVar2 = std::operator<<(poVar2,(string *)source_name);
        std::operator<<(poVar2,")");
        std::__cxx11::string::~string((string *)&sStack_48);
        return;
      }
    }
  }
  iVar1 = (*(type->super_t_doc)._vptr_t_doc[7])(type);
  if ((char)iVar1 != '\0') {
    poVar2 = std::operator<<(out,"new byte[");
    poVar2 = std::operator<<(poVar2,(string *)source_name);
    poVar2 = std::operator<<(poVar2,".length];");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"System.arraycopy(");
    poVar2 = std::operator<<(poVar2,(string *)source_name);
    poVar2 = std::operator<<(poVar2,", 0, ");
    poVar2 = std::operator<<(poVar2,(string *)dest_name);
    poVar2 = std::operator<<(poVar2,", 0, ");
    poVar2 = std::operator<<(poVar2,(string *)source_name);
    std::operator<<(poVar2,".length)");
    return;
  }
  std::operator<<(out,(string *)source_name);
  return;
}

Assistant:

void t_javame_generator::generate_deep_copy_non_container(ostream& out,
                                                          std::string source_name,
                                                          std::string dest_name,
                                                          t_type* type) {
  if (type->is_base_type() || type->is_enum() || type->is_typedef()) {
    // binary fields need to be copied with System.arraycopy
    if (type->is_binary()) {
      out << "new byte[" << source_name << ".length];" << endl;
      indent(out) << "System.arraycopy(" << source_name << ", 0, " << dest_name << ", 0, "
                  << source_name << ".length)";
    }
    // everything else can be copied directly
    else
      out << source_name;
  } else {
    out << "new " << type_name(type, true, true) << "(" << source_name << ")";
  }
}